

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O0

_Bool PPC_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  DecodeStatus DVar1;
  uint16_t *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  MCInst *in_RDI;
  uint64_t in_R8;
  MCRegisterInfo *in_R9;
  DecodeStatus status;
  
  DVar1 = getInstruction(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  return DVar1 == MCDisassembler_Success;
}

Assistant:

bool PPC_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = getInstruction(instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}